

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O3

void __thiscall GlobOpt::ProcessFieldKills(GlobOpt *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  BVSparse<Memory::JitArenaAllocator> *pBVar3;
  undefined4 *puVar4;
  
  bVar2 = DoFieldCopyProp(this);
  if (((bVar2) || (bVar2 = DoObjTypeSpec(this,this->currentBlock->loop), bVar2)) ||
     (bVar2 = DoCSE(this), bVar2)) {
    ProcessFieldKills(this,instr,(this->currentBlock->globOptData).liveFields,true);
    return;
  }
  pBVar3 = (this->currentBlock->globOptData).liveFields;
  do {
    pBVar3 = (BVSparse<Memory::JitArenaAllocator> *)pBVar3->head;
    if (pBVar3 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      return;
    }
  } while (((Type *)&pBVar3->alloc)->word == 0);
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar4 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                     ,0x25a,"(this->currentBlock->globOptData.liveFields->IsEmpty())",
                     "this->currentBlock->globOptData.liveFields->IsEmpty()");
  if (bVar2) {
    *puVar4 = 0;
    return;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void
GlobOpt::ProcessFieldKills(IR::Instr * instr)
{
    if (!this->DoFieldCopyProp() && !this->DoFieldRefOpts() && !DoCSE())
    {
        Assert(this->currentBlock->globOptData.liveFields->IsEmpty());
        return;
    }

    ProcessFieldKills(instr, this->currentBlock->globOptData.liveFields, true);
}